

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O0

int __thiscall AliHttpRequest::ParseUrl(AliHttpRequest *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t buflen;
  long lVar4;
  mapped_type *this_00;
  int len_5;
  int len_4;
  int len_3;
  allocator<char> local_69;
  key_type local_68;
  uint local_44;
  uint local_40;
  int len_2;
  int len_1;
  int len;
  http_parser_url parser_url;
  AliHttpRequest *this_local;
  
  parser_url.field_data._20_8_ = this;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  buflen = std::__cxx11::string::size();
  iVar2 = http_parser_parse_url_(pcVar3,buflen,0,(http_parser_url *)&len_1);
  if (iVar2 == 0) {
    if (((ushort)len_1 & 8) != 0) {
      len_2 = (int)parser_url.field_data[1].len;
      std::__cxx11::string::resize((ulong)&this->path_);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      lVar4 = std::__cxx11::string::c_str();
      strncpy(pcVar3,(char *)(lVar4 + (int)(uint)parser_url.field_data[1].off),(long)len_2);
    }
    if (((ushort)len_1 & 1) != 0) {
      local_40 = (uint)len._2_2_;
      std::__cxx11::string::resize((ulong)&this->sechema_);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      lVar4 = std::__cxx11::string::c_str();
      strncpy(pcVar3,(char *)(lVar4 + (int)(uint)(ushort)len),(long)(int)local_40);
    }
    if (((ushort)len_1 & 2) != 0) {
      local_44 = (uint)parser_url.port;
      std::__cxx11::string::resize((ulong)&this->host_);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      lVar4 = std::__cxx11::string::c_str();
      strncpy(pcVar3,(char *)(lVar4 + (ulong)parser_url.field_set),(long)(int)local_44);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Host",&local_69);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->map_request_headers_,&local_68);
      std::__cxx11::string::operator=((string *)this_00,(string *)&this->host_);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
    }
    if (((ushort)len_1 & 0x10) != 0) {
      std::__cxx11::string::resize((ulong)&this->query_);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      lVar4 = std::__cxx11::string::c_str();
      strncpy(pcVar3,(char *)(lVar4 + (int)(uint)parser_url.field_data[2].off),
              (long)(int)(uint)parser_url.field_data[2].len);
    }
    if (((ushort)len_1 & 0x20) != 0) {
      std::__cxx11::string::resize((ulong)&this->flagment_);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      lVar4 = std::__cxx11::string::c_str();
      strncpy(pcVar3,(char *)(lVar4 + (int)(uint)parser_url.field_data[3].off),
              (long)(int)(uint)parser_url.field_data[3].len);
    }
    if (((ushort)len_1 & 4) == 0) {
      bVar1 = std::operator==(&this->sechema_,"https");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&this->port_,"443");
        this->is_tls = true;
      }
    }
    else {
      std::__cxx11::string::resize((ulong)&this->port_);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      lVar4 = std::__cxx11::string::c_str();
      strncpy(pcVar3,(char *)(lVar4 + (int)(uint)parser_url.field_data[0].off),
              (long)(int)(uint)parser_url.field_data[0].len);
    }
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int AliHttpRequest::ParseUrl() {
  http_parser_url parser_url;
  if(http_parser_parse_url_(url_.c_str(), url_.size(), false, &parser_url) != 0) {
    return -1;
  }
  if(parser_url.field_set &  (1 << UF_PATH)) {
    int len = parser_url.field_data[UF_PATH].len;
    path_.resize(len);
    strncpy((char*)path_.c_str(), url_.c_str() + parser_url.field_data[UF_PATH].off, len);
  }

  if(parser_url.field_set &  (1 << UF_SCHEMA)) {
    int len = parser_url.field_data[UF_SCHEMA].len;
    sechema_.resize(len);
    strncpy((char*)sechema_.c_str(), url_.c_str() + parser_url.field_data[UF_SCHEMA].off, len);
  }

  if(parser_url.field_set & (1 << UF_HOST)) {
    int len = parser_url.field_data[UF_HOST].len;
    host_.resize(len);
    strncpy((char*)host_.c_str(), url_.c_str() + parser_url.field_data[UF_HOST].off, len);
    this->map_request_headers_["Host"] = host_;
  }

  if(parser_url.field_set & (1 << UF_QUERY)) {
    int len = parser_url.field_data[UF_QUERY].len;
    query_.resize(len);
    strncpy((char*)query_.c_str(), url_.c_str() + parser_url.field_data[UF_QUERY].off, len);
  }

  if(parser_url.field_set & (1 << UF_FRAGMENT)) {
    int len = parser_url.field_data[UF_FRAGMENT].len;
    flagment_.resize(len);
    strncpy((char*)flagment_.c_str(), url_.c_str() + parser_url.field_data[UF_FRAGMENT].off, len);
  }

  if(parser_url.field_set & (1 << UF_PORT)) {
    int len = parser_url.field_data[UF_PORT].len;
    port_.resize(len);
    strncpy((char*)port_.c_str(), url_.c_str() + parser_url.field_data[UF_PORT].off, len);
  } else if(sechema_ == "https") {
    port_ = "443";
    this->is_tls = true;
  }

  return 0;
}